

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectPivots(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *threshold)

{
  type_conflict5 tVar1;
  long lVar2;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  self_type *in_RDI;
  Pring *pr;
  int candidates;
  int mkwtz;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  l_maxabs;
  int beg;
  int len;
  int cl;
  int rw;
  int num;
  int count;
  int m;
  int kk;
  int ll;
  int k;
  int j;
  int i;
  int ii;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff918;
  uint7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff928;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff940;
  undefined8 *puVar3;
  undefined1 local_6b8 [112];
  undefined1 local_648 [56];
  undefined1 local_610 [56];
  undefined1 local_5d8 [112];
  undefined1 local_568 [56];
  undefined1 local_530 [56];
  undefined1 local_4f8 [112];
  undefined1 local_488 [56];
  undefined1 local_450 [56];
  undefined4 local_418;
  undefined1 local_414 [112];
  undefined1 local_3a4 [56];
  undefined1 local_36c [56];
  undefined1 local_334 [112];
  undefined1 local_2c4 [56];
  undefined1 local_28c [56];
  undefined4 local_254;
  int local_250;
  int local_24c;
  undefined8 local_248;
  undefined1 local_23c [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_204;
  int local_1cc;
  int local_1c8;
  uint local_1c4;
  uint local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  uint local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 local_188;
  undefined8 *local_180;
  undefined1 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  reference local_168;
  undefined1 *local_160;
  reference local_158;
  undefined1 *local_150;
  reference local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  reference local_128;
  undefined1 *local_120;
  reference local_118;
  undefined1 *local_110;
  reference local_108;
  undefined1 *local_100;
  reference local_f8;
  undefined1 *local_f0;
  reference local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  reference local_70;
  reference local_68;
  undefined1 *local_60;
  reference local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  reference local_48;
  undefined1 *local_40;
  reference local_38;
  undefined1 *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  reference local_20;
  reference local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined8 *local_8;
  
  local_1ac = -1;
  local_1c0 = 0xffffffff;
  local_1c4 = 0xffffffff;
  local_170 = &local_204;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
  local_248 = 0;
  local_178 = local_23c;
  local_180 = &local_248;
  local_188 = 0;
  local_8 = local_180;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_RSI,(double)in_stack_fffffffffffff928,
             (type *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
  local_250 = ((in_RDI->m_backend).data._M_elems[1] - in_RDI[0xd].m_backend.data._M_elems[8]) + -1;
  if (4 < local_250) {
    local_250 = 4;
  }
  local_1bc = 0;
  local_1b8 = 2;
LAB_0038da7f:
  do {
    local_19c = -1;
    if (*(long *)(*(long *)&in_RDI[0xe].m_backend.exp + (long)local_1b8 * 0x20) ==
        *(long *)&in_RDI[0xe].m_backend.exp + (long)local_1b8 * 0x20) {
      if (*(long *)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 6) + (long)local_1b8 * 0x20) ==
          *(long *)(in_RDI[0xe].m_backend.data._M_elems + 6) + (long)local_1b8 * 0x20) {
        local_1b8 = local_1b8 + 1;
        goto LAB_0038da7f;
      }
      local_1c4 = *(uint *)(*(long *)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 6) +
                                     (long)local_1b8 * 0x20) + 0x10);
      local_1c8 = *(int *)(*(long *)&in_RDI[0xb].m_backend.fpclass + (long)(int)local_1c4 * 4) +
                  *(int *)(*(long *)&in_RDI[0xb].m_backend.exp + (long)(int)local_1c4 * 4) + -1;
      local_1cc = (local_1c8 -
                  *(int *)(*(long *)(in_RDI[0xd].m_backend.data._M_elems + 6) +
                          (long)(int)local_1c4 * 4)) + 1;
      local_24c = (in_RDI->m_backend).data._M_elems[1] + 1;
      for (local_1a0 = local_1c8; local_1cc <= local_1a0; local_1a0 = local_1a0 + -1) {
        local_1a8 = *(uint *)(*(long *)(in_RDI[0xb].m_backend.data._M_elems + 2) +
                             (long)local_1a0 * 4);
        local_1a4 = *(int *)(*(long *)(in_RDI[10].m_backend.data._M_elems + 2) +
                            (long)(int)local_1a8 * 4);
        if (local_1a4 < local_24c) {
          std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)(in_RDI + 0xd),(long)(int)local_1a8);
          local_418 = 0;
          tVar1 = boost::multiprecision::operator>
                            (in_stack_fffffffffffff928,
                             (int *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
          if (tVar1) {
            local_1b4 = *(int *)(*(long *)in_RDI[10].m_backend.data._M_elems +
                                (long)(int)local_1a8 * 4);
            local_1b0 = local_1b4 +
                        *(int *)(*(long *)(in_RDI[10].m_backend.data._M_elems + 2) +
                                (long)(int)local_1a8 * 4);
            do {
              local_1b0 = local_1b0 + -1;
              if (local_1b0 < local_1b4) goto LAB_0038e1cd;
            } while (*(uint *)(*(long *)&in_RDI[9].m_backend.fpclass + (long)local_1b0 * 4) !=
                     local_1c4);
            local_48 = std::
                       vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1b0);
            local_40 = local_23c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                       in_stack_fffffffffffff918);
            local_1ac = local_1b0;
LAB_0038e1cd:
            local_58 = std::
                       vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     *)(in_RDI + 0xd),(long)(int)local_1a8);
            local_50 = &local_204;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                       in_stack_fffffffffffff918);
          }
          else {
            local_1b4 = *(int *)(*(long *)in_RDI[10].m_backend.data._M_elems +
                                (long)(int)local_1a8 * 4);
            local_128 = std::
                        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1b4);
            local_120 = local_488;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                       in_stack_fffffffffffff918);
            spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff918);
            local_a0 = &local_204;
            local_a8 = local_450;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                       in_stack_fffffffffffff918);
            local_1b0 = local_1b4 +
                        *(int *)(*(long *)(in_RDI[10].m_backend.data._M_elems + 2) +
                                (long)(int)local_1a8 * 4);
            do {
              local_1b0 = local_1b0 + -1;
              if (local_1b0 < local_1b4) goto LAB_0038e4b9;
              local_118 = std::
                          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1b0);
              local_110 = local_4f8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                         in_stack_fffffffffffff918);
              spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff918);
              tVar1 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_fffffffffffff918,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x38e379);
              if (tVar1) {
                local_108 = std::
                            vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1b0)
                ;
                local_100 = local_568;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)
                           CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                           in_stack_fffffffffffff918);
                spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff918);
                local_b0 = &local_204;
                local_b8 = local_530;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                          ((cpp_dec_float<50U,_int,_void> *)
                           CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                           in_stack_fffffffffffff918);
              }
            } while (*(uint *)(*(long *)&in_RDI[9].m_backend.fpclass + (long)local_1b0 * 4) !=
                     local_1c4);
            local_68 = std::
                       vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1b0);
            local_60 = local_23c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                       in_stack_fffffffffffff918);
            local_1ac = local_1b0;
LAB_0038e4b9:
            while (local_1b0 = local_1b0 + -1, local_1b4 < local_1b0) {
              local_f8 = std::
                         vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1b0);
              local_f0 = local_5d8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                         in_stack_fffffffffffff918);
              spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff918);
              tVar1 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_fffffffffffff918,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x38e541);
              if (tVar1) {
                local_e8 = std::
                           vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1b0);
                local_e0 = local_648;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)
                           CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                           in_stack_fffffffffffff918);
                spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff918);
                local_c0 = &local_204;
                local_c8 = local_610;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                          ((cpp_dec_float<50U,_int,_void> *)
                           CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                           in_stack_fffffffffffff918);
              }
            }
            local_70 = std::
                       vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     *)(in_RDI + 0xd),(long)(int)local_1a8);
            local_78 = &local_204;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                       in_stack_fffffffffffff918);
          }
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator*=(in_stack_fffffffffffff940,in_RDI);
          local_d0 = local_6b8;
          local_d8 = local_23c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                     in_stack_fffffffffffff918);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff918);
          tVar1 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff918,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x38e6a5);
          if (tVar1) {
            local_24c = local_1a4;
            local_1c0 = local_1a8;
            local_19c = local_1ac;
            if (local_1a4 <= local_1b8 + 1) break;
          }
        }
      }
    }
    else {
      local_1c0 = *(uint *)(*(long *)(*(long *)&in_RDI[0xe].m_backend.exp + (long)local_1b8 * 0x20)
                           + 0x10);
      local_1cc = *(int *)(*(long *)in_RDI[10].m_backend.data._M_elems + (long)(int)local_1c0 * 4);
      local_1c8 = *(int *)(*(long *)(in_RDI[10].m_backend.data._M_elems + 2) +
                          (long)(int)local_1c0 * 4) + local_1cc + -1;
      local_18 = std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)(in_RDI + 0xd),(long)(int)local_1c0);
      in_stack_fffffffffffff928 = &local_204;
      local_10 = in_stack_fffffffffffff928;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 in_stack_fffffffffffff918);
      local_254 = 0;
      tVar1 = boost::multiprecision::operator<
                        (in_stack_fffffffffffff928,
                         (int *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      if (tVar1) {
        local_168 = std::
                    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1c8);
        local_160 = local_2c4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                   in_stack_fffffffffffff918);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_fffffffffffff918);
        local_80 = &local_204;
        local_88 = local_28c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                   in_stack_fffffffffffff918);
        local_1a0 = local_1c8;
        while (local_1a0 = local_1a0 + -1, local_1cc <= local_1a0) {
          local_158 = std::
                      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1a0);
          local_150 = local_334;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                     in_stack_fffffffffffff918);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff918);
          tVar1 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff918,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x38dcc8);
          if (tVar1) {
            local_148 = std::
                        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1a0);
            local_140 = local_3a4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                       in_stack_fffffffffffff918);
            spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff918);
            local_90 = &local_204;
            local_98 = local_36c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                       in_stack_fffffffffffff918);
          }
        }
        local_20 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0xd),(long)(int)local_1c0);
        local_28 = &local_204;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                   in_stack_fffffffffffff918);
      }
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator*=(in_stack_fffffffffffff940,in_RDI);
      local_24c = (in_RDI->m_backend).data._M_elems[1] + 1;
      for (local_1a0 = local_1c8; local_1cc <= local_1a0; local_1a0 = local_1a0 + -1) {
        local_1a8 = *(uint *)(*(long *)&in_RDI[9].m_backend.fpclass + (long)local_1a0 * 4);
        local_1a4 = *(int *)(*(long *)(in_RDI[0xd].m_backend.data._M_elems + 6) +
                            (long)(int)local_1a8 * 4);
        local_38 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI[9].m_backend.data._M_elems + 6),(long)local_1a0);
        local_30 = local_23c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                   in_stack_fffffffffffff918);
        in_stack_fffffffffffff927 = false;
        if (local_1a4 < local_24c) {
          local_130 = local_414;
          local_138 = local_23c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)(ulong)in_stack_fffffffffffff920,
                     in_stack_fffffffffffff918);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff918);
          in_stack_fffffffffffff927 =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffff918,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x38defe);
        }
        if ((type_conflict5)in_stack_fffffffffffff927 != false) {
          local_24c = local_1a4;
          local_1c4 = local_1a8;
          local_19c = local_1a0;
          if (local_1a4 <= local_1b8) break;
        }
      }
    }
    *(undefined8 *)
     (*(long *)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 4) + (long)(int)local_1c4 * 0x20) +
     8) = *(undefined8 *)
           (*(long *)(in_RDI[0xe].m_backend.data._M_elems + 4) + (long)(int)local_1c4 * 0x20 + 8);
    **(undefined8 **)
      (*(long *)(in_RDI[0xe].m_backend.data._M_elems + 4) + (long)(int)local_1c4 * 0x20 + 8) =
         *(undefined8 *)
          (*(long *)(in_RDI[0xe].m_backend.data._M_elems + 4) + (long)(int)local_1c4 * 0x20);
    lVar2 = *(long *)(in_RDI[0xe].m_backend.data._M_elems + 4) + (long)(int)local_1c4 * 0x20;
    *(long *)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 4) + (long)(int)local_1c4 * 0x20) =
         lVar2;
    *(long *)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 4) + (long)(int)local_1c4 * 0x20 + 8)
         = lVar2;
    if (-1 < local_19c) {
      *(int *)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20 +
              0x14) =
           local_19c -
           *(int *)(*(long *)in_RDI[10].m_backend.data._M_elems + (long)(int)local_1c0 * 4);
      local_24c = (local_24c + -1) * (local_1b8 + -1);
      *(int *)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20 +
              0x18) = local_24c;
      for (puVar3 = *(undefined8 **)&in_RDI[0xd].m_backend.exp;
          ((-1 < *(int *)(puVar3 + 2) && (*(uint *)(puVar3 + 2) != local_1c0)) &&
          (*(int *)(puVar3 + 3) < local_24c)); puVar3 = (undefined8 *)*puVar3) {
      }
      in_stack_fffffffffffff940 =
           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)puVar3[1];
      if ((in_stack_fffffffffffff940->m_backend).data._M_elems[4] != local_1c0) {
        *(undefined8 *)
         (*(long *)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20
                   ) + 8) =
             *(undefined8 *)
              (*(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20 + 8)
        ;
        **(undefined8 **)
          (*(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20 + 8) =
             *(undefined8 *)
              (*(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20);
        *(undefined8 *)
         (*(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20) =
             *(undefined8 *)(in_stack_fffffffffffff940->m_backend).data._M_elems;
        *(long *)(*(long *)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) +
                           (long)(int)local_1c0 * 0x20) + 8) =
             *(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20;
        *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          **)(*(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20 + 8)
             = in_stack_fffffffffffff940;
        *(long *)(in_stack_fffffffffffff940->m_backend).data._M_elems =
             *(long *)(in_RDI[0xe].m_backend.data._M_elems + 8) + (long)(int)local_1c0 * 0x20;
      }
      local_1bc = local_1bc + 1;
      if (local_250 <= local_1bc) {
        return;
      }
    }
  } while( true );
}

Assistant:

void CLUFactor<R>::selectPivots(R threshold)
{
   int ii;
   int i;
   int j;
   int k;
   int ll = -1; // This value should never be used.
   int kk;
   int m;
   int count;
   int num;
   int rw = -1; // This value should never be used.
   int cl = -1; // This value should never be used.
   int len;
   int beg;
   R l_maxabs;
   R x = R(0.0);   // This value should never be used.
   int mkwtz;
   int candidates;

   candidates = thedim - temp.stage - 1;

   if(candidates > 4)
      candidates = 4;

   num = 0;

   count = 2;

   for(;;)
   {
      ii = -1;

      if(temp.pivot_rowNZ[count].next != &(temp.pivot_rowNZ[count]))
      {
         rw = temp.pivot_rowNZ[count].next->idx;
         beg = u.row.start[rw];
         len = u.row.len[rw] + beg - 1;

         /*  set l_maxabs to maximum absolute value in row
          *  (compute it if necessary).
          */

         if((l_maxabs = temp.s_max[rw]) < 0)
         {
            l_maxabs = spxAbs(u.row.val[len]);

            for(i = len - 1; i >= beg; --i)
               if(l_maxabs < spxAbs(u.row.val[i]))
                  l_maxabs = spxAbs(u.row.val[i]);

            temp.s_max[rw] = l_maxabs;               /* ##### */
         }

         l_maxabs *= threshold;

         /*  select pivot element with lowest markowitz number in row
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.row.idx[i];
            j = temp.s_cact[k];
            x = u.row.val[i];

            if(j < mkwtz && spxAbs(x) > l_maxabs)
            {
               mkwtz = j;
               cl = k;
               ii = i;

               if(j <= count)               /* ##### */
                  break;
            }
         }
      }
      else if(temp.pivot_colNZ[count].next != &(temp.pivot_colNZ[count]))
      {
         cl = temp.pivot_colNZ[count].next->idx;
         beg = u.col.start[cl];
         len = u.col.len[cl] + beg - 1;
         beg = len - temp.s_cact[cl] + 1;
         assert(count == temp.s_cact[cl]);

         /*  select pivot element with lowest markowitz number in column
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.col.idx[i];
            j = u.row.len[k];

            if(j < mkwtz)
            {
               /*  ensure that element (cl,k) is stable.
                */
               if(temp.s_max[k] > 0)
               {
                  /*  case 1: l_maxabs is known
                   */
                  for(m = u.row.start[k], kk = m + u.row.len[k] - 1;
                        kk >= m; --kk)
                  {
                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  l_maxabs = temp.s_max[k];
               }
               else
               {
                  /*  case 2: l_maxabs needs to be computed
                   */
                  m = u.row.start[k];
                  l_maxabs = spxAbs(u.row.val[m]);

                  for(kk = m + u.row.len[k] - 1; kk >= m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);

                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  for(--kk; kk > m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);
                  }

                  temp.s_max[k] = l_maxabs;
               }

               l_maxabs *= threshold;

               if(spxAbs(x) > l_maxabs)
               {
                  mkwtz = j;
                  rw = k;
                  ii = ll;

                  if(j <= count + 1)
                     break;
               }
            }
         }
      }
      else
      {
         ++count;
         continue;
      }

      assert(cl >= 0);

      removeDR(temp.pivot_col[cl]);
      initDR(temp.pivot_col[cl]);

      if(ii >= 0)
      {
         /*  Initialize selected pivot element
          */
         CLUFactor<R>::Pring* pr;
         temp.pivot_row[rw].pos = ii - u.row.start[rw];
         temp.pivot_row[rw].mkwtz = mkwtz = (mkwtz - 1) * (count - 1);
         // ??? mkwtz originally was long,
         // maybe to avoid an overflow in this instruction?

         for(pr = temp.pivots.next; pr->idx >= 0; pr = pr->next)
         {
            if(pr->idx == rw || pr->mkwtz >= mkwtz)
               break;
         }

         pr = pr->prev;

         if(pr->idx != rw)
         {
            removeDR(temp.pivot_row[rw]);
            init2DR(temp.pivot_row[rw], *pr);
         }

         num++;

         if(num >= candidates)
            break;
      }
   }

   /*
    *     while(temp.temp.next->mkwtz < temp.temp.prev->mkwtz)
    *     {
    *     Pring   *pr;
    *     pr = temp.temp.prev;
    *     removeDR(*pr);
    *     init2DR (*pr, rowNZ[u.row.len[pr->idx]]);
    }
    */

   assert(row.perm[rw] < 0);

   assert(col.perm[cl] < 0);
}